

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_log_helper.h
# Opt level: O2

void __thiscall spdlog::details::async_log_helper::~async_log_helper(async_log_helper *this)

{
  async_msg local_78;
  
  local_78.logger_name._M_dataplus._M_p = (pointer)&local_78.logger_name.field_2;
  local_78.logger_name._M_string_length = 0;
  local_78.logger_name.field_2._M_local_buf[0] = '\0';
  local_78.level = terminate;
  local_78.txt._M_dataplus._M_p = (pointer)&local_78.txt.field_2;
  local_78.time.__d.__r = (duration)0;
  local_78.thread_id = 0;
  local_78.txt._M_string_length = 0;
  local_78.txt.field_2._M_local_buf[0] = '\0';
  local_78.msg_id = 0;
  local_78.msg_type = local_78.level;
  push_msg(this,&local_78);
  async_msg::~async_msg(&local_78);
  std::thread::join();
  std::thread::~thread(&this->_worker_thread);
  std::_Function_base::~_Function_base(&(this->_worker_teardown_cb).super__Function_base);
  std::_Function_base::~_Function_base(&(this->_worker_warmup_cb).super__Function_base);
  std::_Function_base::~_Function_base(&(this->_err_handler).super__Function_base);
  mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::~mpmc_bounded_queue(&this->_q);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::~vector(&this->_sinks);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

inline spdlog::details::async_log_helper::~async_log_helper()
{
    try
    {
        push_msg(async_msg(async_msg_type::terminate));
        _worker_thread.join();
    }
    catch (...) // don't crash in destructor
    {
    }
}